

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glloader.c
# Opt level: O1

ktx_error_code_e
texImage2DCallback(int miplevel,int face,int width,int height,int depth,ktx_uint64_t faceLodSize,
                  void *pixels,void *userdata)

{
  GLenum GVar1;
  int iVar2;
  
  iVar2 = *(int *)((long)userdata + 0x14);
  if (*(int *)((long)userdata + 0x14) == 0) {
    iVar2 = height;
  }
  (*gl.glTexImage2D)(face + *userdata,miplevel,*(GLint *)((long)userdata + 8),width,iVar2,0,
                     *(GLenum *)((long)userdata + 4),*(GLenum *)((long)userdata + 0xc),pixels);
  GVar1 = (*gl.glGetError)();
  *(GLenum *)((long)userdata + 0x10) = GVar1;
  return (uint)(GVar1 != 0) * 9;
}

Assistant:

KTX_error_code
texImage2DCallback(int miplevel, int face,
                   int width, int height,
                   int depth,
                   ktx_uint64_t faceLodSize,
                   void* pixels, void* userdata)
{
    ktx_cbdata* cbData = (ktx_cbdata*)userdata;
    UNUSED(depth);
    UNUSED(faceLodSize);

    glTexImage2D(cbData->glTarget + face, miplevel,
                 cbData->glInternalformat, width,
                 cbData->numLayers == 0 ? (GLuint)height : cbData->numLayers, 0,
                 cbData->glFormat, cbData->glType, pixels);

    if ((cbData->glError = glGetError()) == GL_NO_ERROR) {
        return KTX_SUCCESS;
    } else {
        return KTX_GL_ERROR;
    }
}